

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-maxflow.c
# Opt level: O1

void greatest_set_test_suffix(char *suffix)

{
  greatest_info.name_suffix = suffix;
  return;
}

Assistant:

int main(int argc, char **argv) {
    GREATEST_MAIN_BEGIN(); /* command-line arguments, initialization. */

    /* If tests are run outside of a suite, a default suite is used. */
    RUN_TEST(weird_network);
    RUN_TEST(weird_network2);
    RUN_TEST(weird_network3);
    RUN_TEST(CLRS_network);
    RUN_TEST(non_trivial_network1);
    RUN_TEST(non_trivial_network2);
    RUN_TEST(non_trivial_network3);
    RUN_TEST(no_path_flow);
    RUN_TEST(single_path_flow);
    RUN_TEST(two_path_flow);
    RUN_TEST(random_networks);

    GREATEST_MAIN_END(); /* display results */
}